

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::LICMPass::ProcessFunction(LICMPass *this,Function *f)

{
  bool bVar1;
  Status b;
  IRContext *this_00;
  reference this_01;
  Loop *loop;
  undefined1 local_80 [8];
  iterator it;
  LoopDescriptor *loop_descriptor;
  Status status;
  Function *f_local;
  LICMPass *this_local;
  
  loop_descriptor._4_4_ = SuccessWithoutChange;
  this_00 = Pass::context(&this->super_Pass);
  it.parent_iterators_.c.
  super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)IRContext::GetLoopDescriptor(this_00,f);
  LoopDescriptor::begin
            ((iterator *)local_80,
             (LoopDescriptor *)
             it.parent_iterators_.c.
             super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node);
  while( true ) {
    LoopDescriptor::end((iterator *)&loop,
                        (LoopDescriptor *)
                        it.parent_iterators_.c.
                        super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
    bVar1 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                      ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_80,
                       (PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop);
    PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop);
    if (!bVar1 || loop_descriptor._4_4_ == Failure) break;
    this_01 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                        ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_80);
    bVar1 = Loop::IsNested(this_01);
    if (!bVar1) {
      b = ProcessLoop(this,this_01,f);
      loop_descriptor._4_4_ = CombineStatus(loop_descriptor._4_4_,b);
    }
    PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_80);
  }
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_80);
  return loop_descriptor._4_4_;
}

Assistant:

Pass::Status LICMPass::ProcessFunction(Function* f) {
  Status status = Status::SuccessWithoutChange;
  LoopDescriptor* loop_descriptor = context()->GetLoopDescriptor(f);

  // Process each loop in the function
  for (auto it = loop_descriptor->begin();
       it != loop_descriptor->end() && status != Status::Failure; ++it) {
    Loop& loop = *it;
    // Ignore nested loops, as we will process them in order in ProcessLoop
    if (loop.IsNested()) {
      continue;
    }
    status = CombineStatus(status, ProcessLoop(&loop, f));
  }
  return status;
}